

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O2

int test_bind_impl(char *file,int line,int sock,char *address)

{
  FILE *__stream;
  int iVar1;
  undefined8 in_RAX;
  uint *puVar2;
  char *pcVar3;
  undefined4 in_register_00000014;
  undefined4 uVar4;
  
  uVar4 = (undefined4)((ulong)in_RAX >> 0x20);
  iVar1 = nn_bind(line,CONCAT44(in_register_00000014,sock));
  __stream = _stderr;
  if (-1 < iVar1) {
    return iVar1;
  }
  puVar2 = (uint *)__errno_location();
  pcVar3 = nn_err_strerror(*puVar2);
  fprintf(__stream,"Failed bind to \"%s\": %s [%d] (%s:%d)\n",CONCAT44(in_register_00000014,sock),
          pcVar3,(ulong)*puVar2,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/separation.c"
          ,CONCAT44(uVar4,(int)file));
  nn_err_abort();
}

Assistant:

static int NN_UNUSED test_bind_impl (char *file, int line,
    int sock, char *address)
{
    int rc;

    rc = nn_bind (sock, address);
    if(rc < 0) {
        fprintf (stderr, "Failed bind to \"%s\": %s [%d] (%s:%d)\n",
            address,
            nn_err_strerror (errno),
            (int) errno, file, line);
        nn_err_abort ();
    }
    return rc;
}